

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::PropertyIdOnRegSlotsContainer::Insert
          (PropertyIdOnRegSlotsContainer *this,RegSlot reg,PropertyId propId)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->propertyIdsForRegSlots).ptr == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1610,"(propertyIdsForRegSlots)","propertyIdsForRegSlots");
    if (!bVar3) goto LAB_00774ed6;
    *puVar4 = 0;
  }
  if (this->length <= reg) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1611,"(reg < length)","reg < length");
    if (!bVar3) goto LAB_00774ed6;
    *puVar4 = 0;
  }
  iVar1 = (this->propertyIdsForRegSlots).ptr[reg];
  if (iVar1 != propId && iVar1 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1616,
                                "(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId)"
                                ,
                                "propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId"
                               );
    if (!bVar3) {
LAB_00774ed6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  (this->propertyIdsForRegSlots).ptr[reg] = propId;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::Insert(RegSlot reg, PropertyId propId)
    {
        //
        // Reg is being used as an index;

        Assert(propertyIdsForRegSlots);
        Assert(reg < length);

        //
        // the current reg is unaccounted for const reg count. while fetching calculate the actual regslot value.

        Assert(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId);
        propertyIdsForRegSlots[reg] = propId;
    }